

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

int nn_ws_handshake_parse_client_opening(nn_ws_handshake *self)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  char *pcVar4;
  char **in_RDI;
  size_t conn_len;
  char *conn;
  uint i;
  char *pos;
  int rc;
  undefined8 in_stack_ffffffffffffffc8;
  nn_pipebase *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint uVar5;
  char **subj;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  int iVar6;
  
  pvVar2 = memchr(in_RDI + 0x30,0,0x1000);
  if (pvVar2 == (void *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "memchr (self->opening_hs, \'\\0\', sizeof (self->opening_hs))",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x35e);
    fflush(_stderr);
    nn_err_abort();
  }
  sVar3 = strlen((char *)(in_RDI + 0x30));
  if (0xfff < sVar3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "strlen (self->opening_hs) < sizeof (self->opening_hs)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
            ,0x362);
    fflush(_stderr);
    nn_err_abort();
  }
  subj = in_RDI + 0x30;
  pcVar4 = strstr((char *)subj,"\r\n\r\n");
  if (pcVar4 == (char *)0x0) {
    iVar6 = 1;
  }
  else {
    in_RDI[0x233] = (char *)0x0;
    in_RDI[0x235] = (char *)0x0;
    in_RDI[0x237] = (char *)0x0;
    in_RDI[0x239] = (char *)0x0;
    in_RDI[0x23b] = (char *)0x0;
    in_RDI[0x23d] = (char *)0x0;
    in_RDI[0x23f] = (char *)0x0;
    in_RDI[0x24d] = (char *)0x0;
    in_RDI[0x234] = (char *)0x0;
    in_RDI[0x236] = (char *)0x0;
    in_RDI[0x238] = (char *)0x0;
    in_RDI[0x23a] = (char *)0x0;
    in_RDI[0x23c] = (char *)0x0;
    in_RDI[0x23e] = (char *)0x0;
    in_RDI[0x240] = (char *)0x0;
    in_RDI[0x24e] = (char *)0x0;
    *(undefined4 *)(in_RDI + 0x251) = 0xffffffff;
    iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                              subj,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    if (iVar6 == 0) {
      iVar6 = -1;
    }
    else {
      iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc,
                                in_stack_fffffffffffffff8,in_RDI,
                                (size_t *)
                                CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar6 == 0) {
        iVar6 = -1;
      }
      else {
        iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8),subj,
                                  in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
        if (iVar6 == 0) {
          iVar6 = -1;
        }
        else {
          iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                     in_stack_ffffffffffffffe8),subj,
                                    in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
          if (iVar6 == 0) {
            iVar6 = -1;
          }
          else {
            while( true ) {
              iVar6 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
              sVar3 = strlen((char *)subj);
              if (sVar3 == 0) break;
              in_stack_ffffffffffffffd0 = (nn_pipebase *)0x0;
              in_stack_ffffffffffffffc8 = 0;
              iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                         in_stack_ffffffffffffffe8),subj,
                                        in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
              if (iVar6 == 0) {
                iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                           in_stack_ffffffffffffffe8),subj,
                                          in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
                if (iVar6 == 1) {
                  iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc,
                                            in_stack_fffffffffffffff8,in_RDI,
                                            (size_t *)
                                            CONCAT44(in_stack_ffffffffffffffec,
                                                     in_stack_ffffffffffffffe8));
                }
                else {
                  iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                             in_stack_ffffffffffffffe8),subj,
                                            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
                  if (iVar6 == 1) {
                    iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc,
                                              in_stack_fffffffffffffff8,in_RDI,
                                              (size_t *)
                                              CONCAT44(in_stack_ffffffffffffffec,
                                                       in_stack_ffffffffffffffe8));
                  }
                  else {
                    iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                               in_stack_ffffffffffffffe8),subj,
                                              in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
                    if (iVar6 == 1) {
                      iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc,
                                                in_stack_fffffffffffffff8,in_RDI,
                                                (size_t *)
                                                CONCAT44(in_stack_ffffffffffffffec,
                                                         in_stack_ffffffffffffffe8));
                    }
                    else {
                      iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                                 in_stack_ffffffffffffffe8),subj,
                                                in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                      ;
                      if (iVar6 == 1) {
                        iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8,in_RDI,
                                                  (size_t *)
                                                  CONCAT44(in_stack_ffffffffffffffec,
                                                           in_stack_ffffffffffffffe8));
                        pcVar4 = nn_strcasestr((char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                                in_stack_ffffffffffffffd8),
                                               (char *)in_stack_ffffffffffffffd0);
                        in_RDI[0x23b] = pcVar4;
                        if (in_RDI[0x23b] != (char *)0x0) {
                          in_RDI[0x23c] = (char *)0x7;
                        }
                      }
                      else {
                        iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                                   in_stack_ffffffffffffffe8),subj,
                                                  in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8);
                        if (iVar6 == 1) {
                          iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc
                                                    ,in_stack_fffffffffffffff8,in_RDI,
                                                    (size_t *)
                                                    CONCAT44(in_stack_ffffffffffffffec,
                                                             in_stack_ffffffffffffffe8));
                        }
                        else {
                          iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                                     in_stack_ffffffffffffffe8),subj
                                                    ,in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8);
                          if (iVar6 == 1) {
                            iVar6 = nn_ws_match_value(conn,(char **)conn_len,
                                                      in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8,in_RDI,
                                                      (size_t *)
                                                      CONCAT44(in_stack_ffffffffffffffec,
                                                               in_stack_ffffffffffffffe8));
                          }
                          else {
                            iVar6 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                                       in_stack_ffffffffffffffe8),
                                                      subj,in_stack_ffffffffffffffdc,
                                                      in_stack_ffffffffffffffd8);
                            if (iVar6 == 1) {
                              iVar6 = nn_ws_match_value(conn,(char **)conn_len,
                                                        in_stack_fffffffffffffffc,
                                                        in_stack_fffffffffffffff8,in_RDI,
                                                        (size_t *)
                                                        CONCAT44(in_stack_ffffffffffffffec,
                                                                 in_stack_ffffffffffffffe8));
                            }
                            else {
                              iVar1 = nn_ws_match_token((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                                         in_stack_ffffffffffffffe8),
                                                        subj,in_stack_ffffffffffffffdc,
                                                        in_stack_ffffffffffffffd8);
                              iVar6 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
                              if (iVar1 == 1) break;
                              iVar6 = nn_ws_match_value(conn,(char **)conn_len,
                                                        in_stack_fffffffffffffffc,
                                                        in_stack_fffffffffffffff8,in_RDI,
                                                        (size_t *)
                                                        CONCAT44(in_stack_ffffffffffffffec,
                                                                 in_stack_ffffffffffffffe8));
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                iVar6 = nn_ws_match_value(conn,(char **)conn_len,in_stack_fffffffffffffffc,
                                          in_stack_fffffffffffffff8,in_RDI,
                                          (size_t *)
                                          CONCAT44(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8));
              }
              if (iVar6 != 1) {
                return -1;
              }
              in_stack_ffffffffffffffec = 1;
            }
            sVar3 = strlen((char *)subj);
            if (sVar3 != 0) {
              nn_backtrace_print();
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (pos) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/ws_handshake.c"
                      ,0x3e0);
              fflush(_stderr);
              nn_err_abort();
            }
            if ((((in_RDI[0x233] == (char *)0x0) || (in_RDI[0x239] == (char *)0x0)) ||
                (in_RDI[0x23b] == (char *)0x0)) ||
               ((in_RDI[0x237] == (char *)0x0 || (in_RDI[0x23d] == (char *)0x0)))) {
              *(undefined4 *)(in_RDI + 0x251) = 3;
              iVar6 = -1;
            }
            else {
              iVar1 = nn_ws_validate_value
                                ((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                  in_stack_ffffffffffffffe8),(char *)subj,
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                 (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
              if (iVar1 == 1) {
                iVar1 = nn_ws_validate_value
                                  ((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                    in_stack_ffffffffffffffe8),(char *)subj,
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                   (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
                if (iVar1 == 1) {
                  iVar1 = nn_ws_validate_value
                                    ((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8),(char *)subj,
                                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                     (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
                  if (iVar1 == 1) {
                    if (in_RDI[0x23f] == (char *)0x0) {
                      iVar6 = nn_pipebase_ispeer(in_stack_ffffffffffffffd0,iVar6);
                      if (iVar6 == 0) {
                        *(undefined4 *)(in_RDI + 0x251) = 6;
                        iVar6 = -1;
                      }
                      else {
                        *(undefined4 *)(in_RDI + 0x251) = 0;
                        iVar6 = 0;
                      }
                    }
                    else {
                      for (uVar5 = 0; uVar5 < 10; uVar5 = uVar5 + 1) {
                        iVar6 = nn_ws_validate_value
                                          ((char *)CONCAT44(in_stack_ffffffffffffffec,
                                                            in_stack_ffffffffffffffe8),(char *)subj,
                                           CONCAT44(uVar5,in_stack_ffffffffffffffd8),
                                           (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
                        if (iVar6 != 0) {
                          if (*(int *)(*(long *)(*(long *)(in_RDI[0x2d] + 0x68) + 0x68) + 4) ==
                              NN_WS_HANDSHAKE_SP_MAP[uVar5].server) {
                            *(undefined4 *)(in_RDI + 0x251) = 0;
                            return 0;
                          }
                          *(undefined4 *)(in_RDI + 0x251) = 6;
                          return -1;
                        }
                      }
                      *(undefined4 *)(in_RDI + 0x251) = 7;
                      iVar6 = -1;
                    }
                  }
                  else {
                    *(undefined4 *)(in_RDI + 0x251) = 3;
                    iVar6 = -1;
                  }
                }
                else {
                  *(undefined4 *)(in_RDI + 0x251) = 3;
                  iVar6 = -1;
                }
              }
              else {
                *(undefined4 *)(in_RDI + 0x251) = 4;
                iVar6 = -1;
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int nn_ws_handshake_parse_client_opening (struct nn_ws_handshake *self)
{
    /*  As per RFC 6455 section 1.7, this parser is not intended to be a
        general-purpose parser for arbitrary HTTP headers. As with the design
        philosophy of nanomsg, application-specific exchanges are better
        reserved for accepted connections, not as fields within these
        headers. */

    int rc;
    const char *pos;
    unsigned i;

    /*  Guarantee that a NULL terminator exists to enable treating this
        recv buffer like a string. */
    nn_assert (memchr (self->opening_hs, '\0', sizeof (self->opening_hs)));

    /*  Having found the NULL terminator, from this point forward string
        functions may be used. */
    nn_assert (strlen (self->opening_hs) < sizeof (self->opening_hs));

    pos = self->opening_hs;

    /*  Is the opening handshake from the client fully received? */
    if (!strstr (pos, NN_WS_HANDSHAKE_TERMSEQ))
        return NN_WS_HANDSHAKE_RECV_MORE;

    self->host = NULL;
    self->origin = NULL;
    self->key = NULL;
    self->upgrade = NULL;
    self->conn = NULL;
    self->version = NULL;
    self->protocol = NULL;
    self->uri = NULL;

    self->host_len = 0;
    self->origin_len = 0;
    self->key_len = 0;
    self->upgrade_len = 0;
    self->conn_len = 0;
    self->version_len = 0;
    self->protocol_len = 0;
    self->uri_len = 0;

    /*  NB: If we got here, we already have a fully received set of
        HTTP headers.  So there is no point in asking for more if the
        headers lack what we need. */

    /*  This function, if generating a return value that triggers
        a response to the client, should replace this sentinel value
        with a proper response code. */
    self->response_code = NN_WS_HANDSHAKE_RESPONSE_NULL;

    /*  RFC 7230 3.1.1 Request Line: HTTP Method
        Note requirement of one space and case sensitivity. */
    if (!nn_ws_match_token ("GET\x20", &pos, 0, 0))
        return NN_WS_HANDSHAKE_INVALID;

    /*  RFC 7230 3.1.1 Request Line: Requested Resource. */
    if (!nn_ws_match_value ("\x20", &pos, 0, 0, &self->uri, &self->uri_len))
        return NN_WS_HANDSHAKE_INVALID;

    /*  RFC 7230 3.1.1 Request Line: HTTP version. Note case sensitivity. */
    if (!nn_ws_match_token ("HTTP/1.1", &pos, 0, 0))
        return NN_WS_HANDSHAKE_INVALID;

    if (!nn_ws_match_token (CRLF, &pos, 0, 0))
        return NN_WS_HANDSHAKE_INVALID;

    /*  It's expected the current position is now at the first
        header field. Match them one by one. */
    while (strlen (pos))
    {
        const char *conn = NULL;
        size_t conn_len = 0;
        if (nn_ws_match_token ("Host:", &pos, 1, 0)) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->host, &self->host_len);
        }
        else if (nn_ws_match_token ("Origin:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->origin, &self->origin_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Key:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->key, &self->key_len);
        }
        else if (nn_ws_match_token ("Upgrade:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->upgrade, &self->upgrade_len);
        }
        else if (nn_ws_match_token ("Connection:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {

            rc = nn_ws_match_value (CRLF, &pos, 1, 1, &conn, &conn_len);

            /*  The values here can be comma delimited, or they can be
                listed as separate Connection headers.  We only care about
                the presence of the Upgrade header, and we're willing to
                assume well-formedness.  This crummy parse may let clients
                send us a malformed header that we ought to reject, but
                we'll just cite Postel's law here if anyone asks. */
            self->conn = nn_strcasestr (conn, "upgrade");
            if (self->conn != NULL) {
                self->conn_len = strlen ("upgrade");
            }
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Version:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->version, &self->version_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Protocol:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->protocol, &self->protocol_len);
        }
        else if (nn_ws_match_token ("Sec-WebSocket-Extensions:",
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                &self->extensions, &self->extensions_len);
        }
        else if (nn_ws_match_token (CRLF,
            &pos, 1, 0) == NN_WS_HANDSHAKE_MATCH) {
            /*  Exit loop since all headers are parsed. */
            break;
        }
        else {
            /*  Skip unknown headers. */
            rc = nn_ws_match_value (CRLF, &pos, 1, 1,
                NULL, NULL);
        }

        if (rc != NN_WS_HANDSHAKE_MATCH)
            return NN_WS_HANDSHAKE_INVALID;
    }

    /*  Validate the opening handshake is now fully parsed. Additionally,
        as per RFC 6455 section 4.1, the client should not send additional data
        after the opening handshake, so this assertion validates upstream recv
        logic prevented this case. */
    nn_assert (strlen (pos) == 0);

    /*  TODO: protocol expectations below this point are hard-coded here as
        an initial design decision. Perhaps in the future these values should
        be settable via compile time (or run-time socket) options? */

    /*  These header fields are required as per RFC 6455 section 4.1. */
    if (!self->host || !self->upgrade || !self->conn ||
        !self->key || !self->version) {
        self->response_code = NN_WS_HANDSHAKE_RESPONSE_WSPROTO;
        return NN_WS_HANDSHAKE_INVALID;
    }

    /*  RFC 6455 section 4.2.1.6 (version December 2011). */
    if (nn_ws_validate_value ("13", self->version,
        self->version_len, 1) != NN_WS_HANDSHAKE_MATCH) {
        self->response_code = NN_WS_HANDSHAKE_RESPONSE_WSVERSION;
        return NN_WS_HANDSHAKE_INVALID;
    }

    /*  RFC 6455 section 4.2.1.3 (version December 2011). */
    if (nn_ws_validate_value ("websocket", self->upgrade,
        self->upgrade_len, 1) != NN_WS_HANDSHAKE_MATCH) {
        self->response_code = NN_WS_HANDSHAKE_RESPONSE_WSPROTO;
        return NN_WS_HANDSHAKE_INVALID;
    }

    /*  RFC 6455 section 4.2.1.4 (version December 2011). */
    if (nn_ws_validate_value ("Upgrade", self->conn,
        self->conn_len, 1) != NN_WS_HANDSHAKE_MATCH) {
        self->response_code = NN_WS_HANDSHAKE_RESPONSE_WSPROTO;
        return NN_WS_HANDSHAKE_INVALID;
    }

    /*  At this point, client meets RFC 6455 compliance for opening handshake.
        Now it's time to check nanomsg-imposed required handshake values. */
    if (self->protocol) {
        /*  Ensure the client SP is a compatible socket type. */
        for (i = 0; i < NN_WS_HANDSHAKE_SP_MAP_LEN; i++) {
            if (nn_ws_validate_value (NN_WS_HANDSHAKE_SP_MAP [i].ws_sp,
                self->protocol, self->protocol_len, 1)) {

                if (self->pipebase->sock->socktype->protocol ==
                    NN_WS_HANDSHAKE_SP_MAP [i].server) {
                    self->response_code = NN_WS_HANDSHAKE_RESPONSE_OK;
                    return NN_WS_HANDSHAKE_VALID;
                }
                else {
                    self->response_code = NN_WS_HANDSHAKE_RESPONSE_NOTPEER;
                    return NN_WS_HANDSHAKE_INVALID;
                }
                break;
            }
        }

        self->response_code = NN_WS_HANDSHAKE_RESPONSE_UNKNOWNTYPE;
        return NN_WS_HANDSHAKE_INVALID;
    }
    else {
        /*  Be permissive and generous here, assuming that if a protocol is
            not explicitly declared, PAIR is presumed. This enables
            interoperability with non-nanomsg remote peers, nominally by
            making the local socket PAIR type. For any other local
            socket type, we expect connection to be rejected as
            incompatible if the header is not specified. */

        if (nn_pipebase_ispeer (self->pipebase, NN_PAIR)) {
            self->response_code = NN_WS_HANDSHAKE_RESPONSE_OK;
            return NN_WS_HANDSHAKE_VALID;
        }
        else {
            self->response_code = NN_WS_HANDSHAKE_RESPONSE_NOTPEER;
            return NN_WS_HANDSHAKE_INVALID;
        }
    }
}